

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwht4x4_sse4_1(int16_t *input,tran_low_t *output,int stride)

{
  int iVar1;
  int iVar3;
  int iVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar2 [16];
  int iVar5;
  int iVar6;
  int iVar8;
  int iVar9;
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  int iVar10;
  int iVar11;
  int iVar13;
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  
  auVar2 = pmovsxwd(in_XMM0,*(undefined8 *)input);
  auVar12 = pmovsxwd(in_XMM2,*(undefined8 *)(input + stride));
  auVar7 = pmovsxwd(in_XMM1,*(undefined8 *)(input + stride * 3));
  auVar14 = pmovsxwd(in_XMM3,*(undefined8 *)(input + stride * 2));
  iVar1 = auVar2._0_4_ + auVar12._0_4_;
  iVar3 = auVar2._4_4_ + auVar12._4_4_;
  iVar4 = auVar2._8_4_ + auVar12._8_4_;
  iVar5 = auVar2._12_4_ + auVar12._12_4_;
  iVar6 = auVar7._0_4_ - auVar14._0_4_;
  iVar8 = auVar7._4_4_ - auVar14._4_4_;
  iVar9 = auVar7._8_4_ - auVar14._8_4_;
  iVar10 = auVar7._12_4_ - auVar14._12_4_;
  iVar15 = iVar1 - iVar6 >> 1;
  iVar17 = iVar3 - iVar8 >> 1;
  iVar18 = iVar4 - iVar9 >> 1;
  iVar20 = iVar5 - iVar10 >> 1;
  iVar21 = iVar15 - auVar14._0_4_;
  iVar22 = iVar17 - auVar14._4_4_;
  iVar23 = iVar18 - auVar14._8_4_;
  iVar24 = iVar20 - auVar14._12_4_;
  iVar3 = iVar3 - iVar22;
  iVar4 = iVar4 - iVar23;
  iVar15 = iVar15 - auVar12._0_4_;
  iVar17 = iVar17 - auVar12._4_4_;
  iVar18 = iVar18 - auVar12._8_4_;
  iVar20 = iVar20 - auVar12._12_4_;
  iVar8 = iVar8 + iVar17;
  iVar9 = iVar9 + iVar18;
  iVar11 = (iVar1 - iVar21) + iVar3;
  iVar21 = iVar21 + iVar22;
  iVar13 = iVar6 + iVar15 + iVar8;
  iVar15 = iVar15 + iVar17;
  iVar16 = (iVar5 - iVar24) - iVar4;
  iVar24 = iVar24 - iVar23;
  iVar19 = (iVar10 + iVar20) - iVar9;
  iVar20 = iVar20 - iVar18;
  iVar1 = iVar11 - iVar16 >> 1;
  iVar5 = iVar21 - iVar24 >> 1;
  iVar6 = iVar13 - iVar19 >> 1;
  iVar10 = iVar15 - iVar20 >> 1;
  iVar3 = iVar1 - iVar3;
  iVar22 = iVar5 - iVar22;
  iVar8 = iVar6 - iVar8;
  iVar17 = iVar10 - iVar17;
  iVar1 = iVar1 - iVar4;
  iVar5 = iVar5 - iVar23;
  iVar6 = iVar6 - iVar9;
  iVar10 = iVar10 - iVar18;
  *output = (iVar11 - iVar1) * 4;
  output[1] = (iVar21 - iVar5) * 4;
  output[2] = (iVar13 - iVar6) * 4;
  output[3] = (iVar15 - iVar10) * 4;
  output[4] = iVar1 * 4;
  output[5] = iVar5 * 4;
  output[6] = iVar6 * 4;
  output[7] = iVar10 * 4;
  output[8] = (iVar16 + iVar3) * 4;
  output[9] = (iVar24 + iVar22) * 4;
  output[10] = (iVar19 + iVar8) * 4;
  output[0xb] = (iVar20 + iVar17) * 4;
  output[0xc] = iVar3 * 4;
  output[0xd] = iVar22 * 4;
  output[0xe] = iVar8 * 4;
  output[0xf] = iVar17 * 4;
  return;
}

Assistant:

void av1_fwht4x4_sse4_1(const int16_t *input, tran_low_t *output, int stride) {
  __m128i in[4];
  in[0] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  in[1] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
  in[2] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
  in[3] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));

  // Convert to int32_t.
  __m128i op[4];
  op[0] = _mm_cvtepi16_epi32(in[0]);
  op[1] = _mm_cvtepi16_epi32(in[1]);
  op[2] = _mm_cvtepi16_epi32(in[2]);
  op[3] = _mm_cvtepi16_epi32(in[3]);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i b1 = op[1];
    __m128i c1 = op[2];
    __m128i d1 = op[3];
    __m128i e1;

    a1 = _mm_add_epi32(a1, b1);  // a1 += b1
    d1 = _mm_sub_epi32(d1, c1);  // d1 = d1 - c1
    e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, c1);  // a1 -= c1
    d1 = _mm_add_epi32(d1, b1);  // d1 += b1

    op[0] = a1;
    op[1] = c1;
    op[2] = d1;
    op[3] = b1;

    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  op[0] = _mm_slli_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_slli_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_slli_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_slli_epi32(op[3], UNIT_QUANT_SHIFT);

  _mm_storeu_si128((__m128i *)(output + 0), op[0]);
  _mm_storeu_si128((__m128i *)(output + 4), op[1]);
  _mm_storeu_si128((__m128i *)(output + 8), op[2]);
  _mm_storeu_si128((__m128i *)(output + 12), op[3]);
}